

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O2

int copy_source(zip_source_t *from,zip_source_t *to)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  char *__format;
  char *pcVar5;
  FILE *pFVar6;
  zip_uint8_t buf [8192];
  
  iVar1 = zip_source_open();
  pFVar6 = _stderr;
  pcVar5 = progname;
  if (iVar1 < 0) {
    uVar4 = zip_source_error(from);
    uVar4 = zip_error_strerror(uVar4);
    fprintf(pFVar6,"%s: can\'t open source for reading: %s\n",pcVar5,uVar4);
  }
  else {
    iVar1 = zip_source_begin_write(to);
    pFVar6 = _stderr;
    pcVar5 = progname;
    if (iVar1 < 0) {
      uVar4 = zip_source_error(to);
      uVar4 = zip_error_strerror(uVar4);
      fprintf(pFVar6,"%s: can\'t open source for writing: %s\n",pcVar5,uVar4);
      zip_source_close(from);
    }
    else {
      do {
        lVar2 = zip_source_read(from,buf,0x2000);
        pFVar6 = _stderr;
        pcVar5 = progname;
        if (lVar2 < 1) {
          if (lVar2 < 0) {
            uVar4 = zip_source_error(from);
            uVar4 = zip_error_strerror(uVar4);
            __format = "%s: can\'t read from source: %s\n";
            goto LAB_001026da;
          }
          zip_source_close(from);
          iVar1 = zip_source_commit_write(to);
          pFVar6 = _stderr;
          pcVar5 = progname;
          if (-1 < iVar1) {
            return 0;
          }
          uVar4 = zip_source_error(to);
          uVar4 = zip_error_strerror(uVar4);
          fprintf(pFVar6,"%s: can\'t commit source: %s\n",pcVar5,uVar4);
          goto LAB_001026f2;
        }
        lVar3 = zip_source_write(to,buf,lVar2);
        pFVar6 = _stderr;
        pcVar5 = progname;
      } while (lVar3 == lVar2);
      uVar4 = zip_source_error(to);
      uVar4 = zip_error_strerror(uVar4);
      __format = "%s: can\'t write to source: %s\n";
LAB_001026da:
      fprintf(pFVar6,__format,pcVar5,uVar4);
      zip_source_close(from);
LAB_001026f2:
      zip_source_rollback_write(to);
    }
  }
  return -1;
}

Assistant:

static int
copy_source(zip_source_t *from, zip_source_t *to) {
    zip_uint8_t buf[8192];
    zip_int64_t n;

    if (zip_source_open(from) < 0) {
	fprintf(stderr, "%s: can't open source for reading: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	return -1;
    }

    if (zip_source_begin_write(to) < 0) {
	fprintf(stderr, "%s: can't open source for writing: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_close(from);
	return -1;
    }

    while ((n = zip_source_read(from, buf, sizeof(buf))) > 0) {
	if (zip_source_write(to, buf, (zip_uint64_t)n) != n) {
	    fprintf(stderr, "%s: can't write to source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	    zip_source_close(from);
	    zip_source_rollback_write(to);
	    return -1;
	}
    }

    if (n < 0) {
	fprintf(stderr, "%s: can't read from source: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	zip_source_close(from);
	zip_source_rollback_write(to);
	return -1;
    }

    zip_source_close(from);

    if (zip_source_commit_write(to) < 0) {
	fprintf(stderr, "%s: can't commit source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_rollback_write(to);
	return -1;
    }

    return 0;
}